

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O0

void __thiscall ZXing::OneD::PartialResult::PartialResult(PartialResult *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  PatternView::PatternView((PatternView *)(in_RDI + 0x20));
  *(undefined4 *)(in_RDI + 0x40) = 0;
  std::__cxx11::string::reserve((ulong)in_RDI);
  return;
}

Assistant:

PartialResult() { txt.reserve(14); }